

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
** __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
::mutable_child(btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                *this,int i)

{
  template_ElementType<3L> *ppbVar1;
  int i_local;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *this_local;
  
  ppbVar1 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
            ::GetField<3l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                            *)this);
  return ppbVar1 + i;
}

Assistant:

btree_node *&mutable_child(int i) { return GetField<3>()[i]; }